

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

bool __thiscall xercesc_4_0::CMStateSet::operator==(CMStateSet *this,CMStateSet *setToCompare)

{
  int *piVar1;
  int *piVar2;
  XMLInt32 *pXVar3;
  CMDynamicBuffer *pCVar4;
  XMLInt32 *pXVar5;
  long lVar6;
  XMLSize_t XVar7;
  bool bVar8;
  
  if (this->fBitCount == setToCompare->fBitCount) {
    pCVar4 = this->fDynamicBuffer;
    if (pCVar4 == (CMDynamicBuffer *)0x0) {
      lVar6 = 0;
      do {
        bVar8 = lVar6 == 4;
        if (bVar8) {
          return bVar8;
        }
        pXVar5 = this->fBits + lVar6;
        pXVar3 = setToCompare->fBits + lVar6;
        lVar6 = lVar6 + 1;
      } while (*pXVar5 == *pXVar3);
    }
    else {
      for (XVar7 = 0; bVar8 = XVar7 == pCVar4->fArraySize, !bVar8; XVar7 = XVar7 + 1) {
        pXVar5 = setToCompare->fDynamicBuffer->fBitArray[XVar7];
        if (pCVar4->fBitArray[XVar7] == (XMLInt32 *)0x0) {
          if (pXVar5 != (XMLInt32 *)0x0) {
            return bVar8;
          }
        }
        else {
          if (pXVar5 == (XMLInt32 *)0x0) {
            return bVar8;
          }
          lVar6 = 0;
          while (lVar6 != 0x20) {
            piVar1 = pCVar4->fBitArray[XVar7] + lVar6;
            piVar2 = pXVar5 + lVar6;
            lVar6 = lVar6 + 1;
            if (*piVar1 != *piVar2) goto LAB_002e5511;
          }
        }
      }
    }
  }
  else {
LAB_002e5511:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool operator==(const CMStateSet& setToCompare) const
    {
        if (fBitCount != setToCompare.fBitCount)
            return false;

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
            {
                if (fBits[index] != setToCompare.fBits[index])
                    return false;
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToCompare.fDynamicBuffer->fBitArray[index],
                         *& mine = fDynamicBuffer->fBitArray[index];
                if(mine==NULL && other==NULL)
                    continue;
                else if(mine==NULL || other==NULL) // the other should have been empty too
                    return false;
                else
                {
                    for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        if(mine[subIndex]!=other[subIndex])
                            return false;
                }
            }
        }
        return true;
    }